

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * getblocktemplate(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  initializer_list<RPCResult> __l_07;
  initializer_list<RPCResult> __l_08;
  initializer_list<RPCResult> __l_09;
  initializer_list<RPCResult> __l_10;
  initializer_list<RPCResult> __l_11;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffbd88;
  allocator<RPCArg> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffbd90;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffbd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbda0;
  RPCResults *in_stack_ffffffffffffbdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbdc0;
  allocator<char> *in_stack_ffffffffffffbdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbdd0;
  undefined7 in_stack_ffffffffffffbdd8;
  undefined1 in_stack_ffffffffffffbddf;
  string *in_stack_ffffffffffffbde0;
  undefined7 in_stack_ffffffffffffbde8;
  undefined1 in_stack_ffffffffffffbdef;
  undefined4 in_stack_ffffffffffffbdf0;
  Type in_stack_ffffffffffffbdf4;
  string *in_stack_ffffffffffffbdf8;
  undefined4 in_stack_ffffffffffffbe00;
  Type in_stack_ffffffffffffbe04;
  undefined4 in_stack_ffffffffffffbe08;
  Type in_stack_ffffffffffffbe0c;
  RPCArg *in_stack_ffffffffffffbe10;
  RPCArgOptions *in_stack_ffffffffffffbe30;
  RPCExamples *in_stack_ffffffffffffbed0;
  RPCResults *in_stack_ffffffffffffbed8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffbee0;
  string *in_stack_ffffffffffffbee8;
  string *in_stack_ffffffffffffbef0;
  RPCHelpMan *in_stack_ffffffffffffbef8;
  undefined1 *local_4028;
  RPCMethodImpl *in_stack_ffffffffffffbff0;
  undefined1 *local_3ff8;
  undefined1 *local_3fe0;
  undefined1 *local_3fc8;
  undefined1 *local_3fb0;
  undefined1 *local_3f98;
  undefined1 *local_3f80;
  undefined1 *local_3f68;
  undefined1 *local_3f50;
  undefined1 *local_3f38;
  undefined1 *local_3f20;
  undefined1 *local_3f08;
  allocator<RPCArg> *local_3ef0;
  undefined1 local_3780 [36];
  allocator<char> local_375c;
  allocator<char> local_375b;
  allocator<char> local_375a [2];
  pointer local_3758;
  pointer pRStack_3750;
  pointer local_3748;
  allocator<char> local_373a;
  allocator<char> local_3739 [31];
  allocator<char> local_371a;
  allocator<char> local_3719 [31];
  allocator<char> local_36fa;
  allocator<char> local_36f9 [17];
  undefined8 local_36e8;
  allocator<char> local_36da;
  allocator<char> local_36d9;
  size_type local_36d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_36d0;
  allocator<char> local_36b9;
  _Alloc_hider local_36b8;
  size_type sStack_36b0;
  undefined1 local_36a8 [15];
  allocator<char> local_3699;
  pointer local_3698;
  pointer pbStack_3690;
  pointer local_3688;
  allocator<char> local_367a;
  allocator<char> local_3679;
  undefined8 local_3678;
  undefined8 uStack_3670;
  undefined8 local_3668;
  allocator<char> local_365a;
  allocator<char> local_3659;
  undefined8 local_3658;
  undefined8 uStack_3650;
  undefined8 local_3648;
  allocator<char> local_363b;
  allocator<char> local_363a [2];
  undefined8 local_3638;
  undefined8 uStack_3630;
  undefined8 local_3628;
  allocator<char> local_361a;
  allocator<char> local_3619 [31];
  allocator<char> local_35fa;
  allocator<char> local_35f9;
  undefined8 local_35f8;
  undefined8 uStack_35f0;
  undefined8 local_35e8;
  allocator<char> local_35d9;
  undefined8 local_35d8;
  undefined8 uStack_35d0;
  undefined8 local_35c8;
  allocator<char> local_35ba;
  allocator<char> local_35b9;
  undefined8 local_35b8;
  undefined8 uStack_35b0;
  undefined8 local_35a8;
  allocator<char> local_359a;
  allocator<char> local_3599;
  undefined8 local_3598;
  undefined8 uStack_3590;
  undefined8 local_3588;
  allocator<char> local_357b;
  allocator<char> local_357a [2];
  undefined8 local_3578;
  undefined8 uStack_3570;
  undefined8 local_3568;
  allocator<char> local_355a;
  allocator<char> local_3559 [29];
  allocator<char> local_353c;
  allocator<char> local_353b [3];
  undefined8 local_3538;
  undefined8 uStack_3530;
  undefined8 local_3528;
  allocator<char> local_351a;
  allocator<char> local_3519;
  undefined8 local_3518;
  undefined8 uStack_3510;
  undefined8 local_3508;
  allocator<char> local_34fa;
  allocator<char> local_34f9;
  undefined8 local_34f8;
  undefined8 uStack_34f0;
  undefined8 local_34e8;
  allocator<char> local_34db;
  allocator<char> local_34da [2];
  undefined8 local_34d8;
  undefined8 uStack_34d0;
  undefined8 local_34c8;
  allocator<char> local_34ba;
  allocator<char> local_34b9 [31];
  allocator<char> local_349a;
  allocator<char> local_3499;
  undefined8 local_3498;
  undefined8 uStack_3490;
  undefined8 local_3488;
  allocator<char> local_347a;
  allocator<char> local_3479;
  undefined8 local_3478;
  undefined8 uStack_3470;
  undefined8 local_3468;
  allocator<char> local_345a;
  allocator<char> local_3459;
  undefined8 local_3458;
  undefined8 uStack_3450;
  undefined8 local_3448;
  allocator<char> local_343a;
  allocator<char> local_3439 [31];
  allocator<char> local_341a;
  allocator<char> local_3419 [31];
  allocator<char> local_33fa;
  allocator<char> local_33f9;
  undefined8 local_33f8;
  undefined8 uStack_33f0;
  undefined8 local_33e8;
  allocator<char> local_33da;
  allocator<char> local_33d9;
  undefined8 local_33d8;
  undefined8 uStack_33d0;
  undefined8 local_33c8;
  allocator<char> local_33bb;
  allocator<char> local_33ba [2];
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  allocator<char> local_339a;
  allocator<char> local_3399 [30];
  allocator<char> local_337b;
  allocator<char> local_337a [2];
  undefined8 local_3378;
  undefined8 uStack_3370;
  undefined8 local_3368;
  allocator<char> local_335a;
  allocator<char> local_3359 [30];
  allocator<char> local_333b;
  allocator<char> local_333a [2];
  undefined8 local_3338;
  undefined8 uStack_3330;
  undefined8 local_3328;
  allocator<char> local_331a;
  allocator<char> local_3319 [31];
  allocator<char> local_32fa;
  allocator<char> local_32f9;
  undefined8 local_32f8;
  undefined8 uStack_32f0;
  undefined8 local_32e8;
  allocator<char> local_32da;
  allocator<char> local_32d9 [30];
  allocator<char> local_32bb;
  allocator<char> local_32ba;
  allocator<char> local_32b9;
  undefined8 local_32b8;
  undefined8 uStack_32b0;
  undefined8 local_32a8;
  allocator<char> local_329b;
  allocator<char> local_329a;
  allocator<char> local_3299;
  undefined8 local_3298;
  undefined8 uStack_3290;
  undefined8 local_3288;
  allocator<char> local_327b;
  allocator<char> local_327a;
  allocator<char> local_3279 [32];
  allocator<char> local_3259;
  undefined4 local_3258;
  allocator<char> local_3252;
  allocator<char> local_3251;
  undefined4 local_3250;
  allocator<char> local_324b [2];
  allocator<char> local_3249;
  undefined4 local_3248;
  allocator<char> local_3242;
  allocator<char> local_3241;
  undefined4 local_3240;
  allocator<char> local_3239 [32];
  allocator<char> local_3219;
  undefined4 local_3218;
  allocator<char> local_3213 [2];
  allocator<char> local_3211;
  undefined4 local_3210;
  allocator<char> local_3209 [32];
  allocator<char> local_31e9;
  undefined4 local_31e8;
  allocator<char> local_31e2;
  allocator<char> local_31e1;
  undefined4 local_31e0;
  allocator<char> local_31d9 [32];
  allocator<char> local_31b9;
  undefined4 local_31b8;
  allocator<char> local_31b1 [31];
  allocator<char> local_3192;
  allocator<char> local_3191 [401];
  undefined8 local_3000;
  undefined1 local_2e10 [136];
  undefined1 local_2d88 [384];
  undefined1 local_2c08 [136];
  undefined1 local_2b80 [320];
  undefined1 local_2a40 [136];
  undefined1 local_29b8 [256];
  undefined1 local_28b8 [952];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [136];
  undefined1 local_2438 [256];
  undefined1 local_2338 [136];
  undefined1 local_22b0 [128];
  undefined1 local_2230 [136];
  undefined1 local_21a8 [128];
  undefined1 local_2128 [136];
  undefined1 local_20a0 [128];
  undefined1 local_2020 [32];
  undefined8 local_2000;
  undefined1 local_1470 [288];
  allocator<RPCArg> local_1350 [408];
  allocator<RPCArg> local_11b8 [40];
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined1 local_1178;
  undefined1 local_1177;
  undefined1 local_1170;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined1 local_1130;
  undefined1 local_112f;
  undefined1 local_1088;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined1 local_1048;
  undefined1 local_1047;
  undefined8 local_1000;
  allocator<RPCArg> local_fa0 [40];
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined1 local_f60;
  undefined1 local_f5f;
  undefined1 local_f58;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined1 local_f18;
  undefined1 local_f17;
  undefined1 local_e70;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined1 local_e30;
  undefined1 local_e2f;
  undefined1 local_d88 [528];
  undefined1 local_b78 [160];
  allocator<RPCArg> local_ad8 [40];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined1 local_a98;
  undefined1 local_a97;
  undefined1 local_a90;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined1 local_a50;
  undefined1 local_a4f;
  undefined1 local_9a8 [264];
  undefined1 local_8a0 [160];
  undefined1 local_800;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0;
  undefined1 local_7bf;
  undefined1 local_718 [1320];
  undefined1 local_1f0 [160];
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_3000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_31b8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_31e0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_800 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffbd88);
  local_7c0 = 0;
  local_7bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                 in_stack_ffffffffffffbdf8,in_stack_ffffffffffffbdf4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbde0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_31e8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3210 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_a90 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_a68 = 0;
  uStack_a60 = 0;
  local_a58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffbd88);
  local_a50 = 0;
  local_a4f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                 in_stack_ffffffffffffbdf8,in_stack_ffffffffffffbdf4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbde0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffbd88);
  __l._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbdc8,__l,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  local_ad8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_ab0 = 0;
  uStack_aa8 = 0;
  local_aa0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffbd88);
  local_a98 = 0;
  local_a97 = 0;
  paVar2 = local_ad8;
  RPCArg::RPCArg(in_stack_ffffffffffffbe10,
                 (string *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
                 in_stack_ffffffffffffbe04,(Fallback *)in_stack_ffffffffffffbdf8,
                 (string *)CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbe30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3218 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3240 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_e70 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_e48 = 0;
  uStack_e40 = 0;
  local_e38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_e30 = 0;
  local_e2f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                 in_stack_ffffffffffffbdf8,in_stack_ffffffffffffbdf4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbde0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3248 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_f58 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_f30 = 0;
  uStack_f28 = 0;
  local_f20 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_f18 = 0;
  local_f17 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                 in_stack_ffffffffffffbdf8,in_stack_ffffffffffffbdf4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbde0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbdc8,__l_00,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  local_fa0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_f78 = 0;
  uStack_f70 = 0;
  local_f68 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_f60 = 0;
  local_f5f = 0;
  paVar2 = local_fa0;
  RPCArg::RPCArg(in_stack_ffffffffffffbe10,
                 (string *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
                 in_stack_ffffffffffffbe04,(Fallback *)in_stack_ffffffffffffbdf8,
                 (string *)CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbe30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3250 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_1088 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_1060 = 0;
  uStack_1058 = 0;
  local_1050 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1048 = 0;
  local_1047 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                 in_stack_ffffffffffffbdf8,in_stack_ffffffffffffbdf4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbde0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3258 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffbd98,(Optional *)in_stack_ffffffffffffbd90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_1170 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_1148 = 0;
  uStack_1140 = 0;
  local_1138 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1130 = 0;
  local_112f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                 in_stack_ffffffffffffbdf8,in_stack_ffffffffffffbdf4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbde0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbdc8,__l_01,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  local_11b8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffbda0);
  local_1190 = 0;
  uStack_1188 = 0;
  local_1180 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1178 = 0;
  local_1177 = 0;
  paVar2 = local_11b8;
  RPCArg::RPCArg(in_stack_ffffffffffffbe10,
                 (string *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
                 in_stack_ffffffffffffbe04,(Fallback *)in_stack_ffffffffffffbdf8,
                 (string *)CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
                 in_stack_ffffffffffffbe30);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbdc8,__l_02,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3298 = 0;
  uStack_3290 = 0;
  local_3288 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,
             (string *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
             in_stack_ffffffffffffbe04,in_stack_ffffffffffffbdf8,
             (string *)CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_32b8 = 0;
  uStack_32b0 = 0;
  local_32a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,
             (string *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
             in_stack_ffffffffffffbe04,in_stack_ffffffffffffbdf8,
             (string *)CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_32f8 = 0;
  uStack_32f0 = 0;
  local_32e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3338 = 0;
  uStack_3330 = 0;
  local_3328 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_03,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3378 = 0;
  uStack_3370 = 0;
  local_3368 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_04,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_33b8 = 0;
  uStack_33b0 = 0;
  local_33a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_05,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_33d8 = 0;
  uStack_33d0 = 0;
  local_33c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_33f8 = 0;
  uStack_33f0 = 0;
  local_33e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3458 = 0;
  uStack_3450 = 0;
  local_3448 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3478 = 0;
  uStack_3470 = 0;
  local_3468 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3498 = 0;
  uStack_3490 = 0;
  local_3488 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_34d8 = 0;
  uStack_34d0 = 0;
  local_34c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_06._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_06,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_34f8 = 0;
  uStack_34f0 = 0;
  local_34e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3518 = 0;
  uStack_3510 = 0;
  local_3508 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3538 = 0;
  uStack_3530 = 0;
  local_3528 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_07._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_07._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_07._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_07,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_08._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_08._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_08._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_08,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3578 = 0;
  uStack_3570 = 0;
  local_3568 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_09._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_09._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_09._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_09,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3598 = 0;
  uStack_3590 = 0;
  local_3588 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_35b8 = 0;
  uStack_35b0 = 0;
  local_35a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_35d8 = 0;
  uStack_35d0 = 0;
  local_35c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
                 in_stack_ffffffffffffbdd0);
  local_35f8 = 0;
  uStack_35f0 = 0;
  local_35e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3638 = 0;
  uStack_3630 = 0;
  local_3628 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_10._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_10._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_10._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_10,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3658 = 0;
  uStack_3650 = 0;
  local_3648 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3678 = 0;
  uStack_3670 = 0;
  local_3668 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3698 = (pointer)0x0;
  pbStack_3690 = (pointer)0x0;
  local_3688 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_36b8._M_p = (pointer)0x0;
  sStack_36b0 = 0;
  local_36a8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
             in_stack_ffffffffffffbe04,in_stack_ffffffffffffbdf8,
             SUB41(in_stack_ffffffffffffbdf4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbde0,
             (bool)in_stack_ffffffffffffbddf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
                 in_stack_ffffffffffffbdd0);
  local_36d8 = 0;
  aStack_36d0._M_allocated_capacity = 0;
  aStack_36d0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_36f9[1] = (allocator<char>)0x0;
  local_36f9[2] = (allocator<char>)0x0;
  local_36f9[3] = (allocator<char>)0x0;
  local_36f9[4] = (allocator<char>)0x0;
  local_36f9[5] = (allocator<char>)0x0;
  local_36f9[6] = (allocator<char>)0x0;
  local_36f9[7] = (allocator<char>)0x0;
  local_36f9[8] = (allocator<char>)0x0;
  local_36f9[9] = (allocator<char>)0x0;
  local_36f9[10] = (allocator<char>)0x0;
  local_36f9[0xb] = (allocator<char>)0x0;
  local_36f9[0xc] = (allocator<char>)0x0;
  local_36f9[0xd] = (allocator<char>)0x0;
  local_36f9[0xe] = (allocator<char>)0x0;
  local_36f9[0xf] = (allocator<char>)0x0;
  local_36f9[0x10] = (allocator<char>)0x0;
  local_36e8._0_1_ = '\0';
  local_36e8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3719[1] = (allocator<char>)0x0;
  local_3719[2] = (allocator<char>)0x0;
  local_3719[3] = (allocator<char>)0x0;
  local_3719[4] = (allocator<char>)0x0;
  local_3719[5] = (allocator<char>)0x0;
  local_3719[6] = (allocator<char>)0x0;
  local_3719[7] = (allocator<char>)0x0;
  local_3719[8] = (allocator<char>)0x0;
  local_3719[9] = (allocator<char>)0x0;
  local_3719[10] = (allocator<char>)0x0;
  local_3719[0xb] = (allocator<char>)0x0;
  local_3719[0xc] = (allocator<char>)0x0;
  local_3719[0xd] = (allocator<char>)0x0;
  local_3719[0xe] = (allocator<char>)0x0;
  local_3719[0xf] = (allocator<char>)0x0;
  local_3719[0x10] = (allocator<char>)0x0;
  local_3719[0x11] = (allocator<char>)0x0;
  local_3719[0x12] = (allocator<char>)0x0;
  local_3719[0x13] = (allocator<char>)0x0;
  local_3719[0x14] = (allocator<char>)0x0;
  local_3719[0x15] = (allocator<char>)0x0;
  local_3719[0x16] = (allocator<char>)0x0;
  local_3719[0x17] = (allocator<char>)0x0;
  local_3719[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe0c,
             (string *)CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
             in_stack_ffffffffffffbdf8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (bool)in_stack_ffffffffffffbdef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3739[1] = (allocator<char>)0x0;
  local_3739[2] = (allocator<char>)0x0;
  local_3739[3] = (allocator<char>)0x0;
  local_3739[4] = (allocator<char>)0x0;
  local_3739[5] = (allocator<char>)0x0;
  local_3739[6] = (allocator<char>)0x0;
  local_3739[7] = (allocator<char>)0x0;
  local_3739[8] = (allocator<char>)0x0;
  local_3739[9] = (allocator<char>)0x0;
  local_3739[10] = (allocator<char>)0x0;
  local_3739[0xb] = (allocator<char>)0x0;
  local_3739[0xc] = (allocator<char>)0x0;
  local_3739[0xd] = (allocator<char>)0x0;
  local_3739[0xe] = (allocator<char>)0x0;
  local_3739[0xf] = (allocator<char>)0x0;
  local_3739[0x10] = (allocator<char>)0x0;
  local_3739[0x11] = (allocator<char>)0x0;
  local_3739[0x12] = (allocator<char>)0x0;
  local_3739[0x13] = (allocator<char>)0x0;
  local_3739[0x14] = (allocator<char>)0x0;
  local_3739[0x15] = (allocator<char>)0x0;
  local_3739[0x16] = (allocator<char>)0x0;
  local_3739[0x17] = (allocator<char>)0x0;
  local_3739[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
             in_stack_ffffffffffffbe04,in_stack_ffffffffffffbdf8,
             SUB41(in_stack_ffffffffffffbdf4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbde0,
             (bool)in_stack_ffffffffffffbddf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  local_3758 = (pointer)0x0;
  pRStack_3750 = (pointer)0x0;
  local_3748 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  this = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
             in_stack_ffffffffffffbe04,in_stack_ffffffffffffbdf8,
             SUB41(in_stack_ffffffffffffbdf4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbde0,
             (bool)in_stack_ffffffffffffbddf);
  std::allocator<RPCResult>::allocator(this);
  __l_11._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  __l_11._M_array = (iterator)in_stack_ffffffffffffbdd0;
  __l_11._M_len._7_1_ = in_stack_ffffffffffffbddf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbdc8,__l_11,
             (allocator_type *)in_stack_ffffffffffffbdc0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffbe10,
             (string *)CONCAT44(in_stack_ffffffffffffbe0c,in_stack_ffffffffffffbe08),
             in_stack_ffffffffffffbe04,in_stack_ffffffffffffbdf8,
             (string *)CONCAT44(in_stack_ffffffffffffbdf4,in_stack_ffffffffffffbdf0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8));
  results._M_len._0_7_ = in_stack_ffffffffffffbdd8;
  results._M_array = (iterator)in_stack_ffffffffffffbdd0;
  results._M_len._7_1_ = in_stack_ffffffffffffbddf;
  RPCResults::RPCResults(in_stack_ffffffffffffbdb0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  HelpExampleCli(in_stack_ffffffffffffbdc0,in_stack_ffffffffffffbdb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffbddf,in_stack_ffffffffffffbdd8),
             (char *)in_stack_ffffffffffffbdd0,in_stack_ffffffffffffbdc8);
  HelpExampleRpc(in_stack_ffffffffffffbdc0,in_stack_ffffffffffffbdb8);
  std::operator+(in_stack_ffffffffffffbdc0,in_stack_ffffffffffffbdb8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x6130af);
  this_00 = (RPCArg *)local_3780;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getblocktemplate()::__0,void>(in_stack_ffffffffffffbd98,in_stack_ffffffffffffbd90);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffbef8,in_stack_ffffffffffffbef0,in_stack_ffffffffffffbee8,
             in_stack_ffffffffffffbee0,in_stack_ffffffffffffbed8,in_stack_ffffffffffffbed0,
             in_stack_ffffffffffffbff0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_3780 + 0x23));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_375c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_375b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_375a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  local_3ef0 = local_11b8;
  do {
    local_3ef0 = local_3ef0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3ef0 != local_1350);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f08 = local_1470;
  do {
    local_3f08 = local_3f08 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f08 != local_2020);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_373a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3739);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_371a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3719);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_36fa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_36f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_36da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_36d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_36b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_36a8 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3699);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_367a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3679);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_365a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3659);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_363b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_363a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f20 = local_2d88;
  do {
    local_3f20 = local_3f20 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f20 != local_2e10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_361a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3619);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_35fa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_35f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_35d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_35ba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_35b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_359a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3599);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_357b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_357a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f38 = local_2b80;
  do {
    local_3f38 = local_3f38 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f38 != local_2c08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_355a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3559);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_353c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_353b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f50 = local_2438;
  do {
    local_3f50 = local_3f50 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f50 != local_24c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f68 = local_2500;
  do {
    local_3f68 = local_3f68 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f68 != local_28b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_351a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3519);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_34fa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_34f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_34db);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_34da);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f80 = local_29b8;
  do {
    local_3f80 = local_3f80 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f80 != local_2a40);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_34ba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_34b9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_349a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3499);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_347a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3479);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_345a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3459);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_343a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3439);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_341a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3419);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_33fa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_33f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_33da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_33d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_33bb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_33ba);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3f98 = local_22b0;
  do {
    local_3f98 = local_3f98 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3f98 != local_2338);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_339a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3399);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_337b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_337a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3fb0 = local_21a8;
  do {
    local_3fb0 = local_3fb0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3fb0 != local_2230);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_335a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3359);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_333b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_333a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3fc8 = local_20a0;
  do {
    local_3fc8 = local_3fc8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3fc8 != local_2128);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_331a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3319);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_32fa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_32f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_32da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_32d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_32bb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_32ba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_32b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_329b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_329a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3299);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffbd98);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_327b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_327a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3279);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3fe0 = local_48;
  do {
    local_3fe0 = local_3fe0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3fe0 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3ff8 = local_1f0;
  do {
    local_3ff8 = local_3ff8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3ff8 != local_718);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3259);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3252);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3251);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_324b);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar1 = local_b78;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != local_d88);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3249);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3242);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3241);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3239);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3219);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3213);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffbd98);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_4028 = local_8a0;
  do {
    local_4028 = local_4028 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_4028 != local_9a8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3211);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3209);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_31e9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_31e2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_31e1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_31d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_31b9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_31b1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3192);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3191);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblocktemplate()
{
    return RPCHelpMan{"getblocktemplate",
        "\nIf the request parameters include a 'mode' key, that is used to explicitly select between the default 'template' request or a 'proposal'.\n"
        "It returns data needed to construct a block to work on.\n"
        "For full specification, see BIPs 22, 23, 9, and 145:\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0022.mediawiki\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0023.mediawiki\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0009.mediawiki#getblocktemplate_changes\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0145.mediawiki\n",
        {
            {"template_request", RPCArg::Type::OBJ, RPCArg::Optional::NO, "Format of the template",
            {
                {"mode", RPCArg::Type::STR, /* treat as named arg */ RPCArg::Optional::OMITTED, "This must be set to \"template\", \"proposal\" (see BIP 23), or omitted"},
                {"capabilities", RPCArg::Type::ARR, /* treat as named arg */ RPCArg::Optional::OMITTED, "A list of strings",
                {
                    {"str", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "client side supported feature, 'longpoll', 'coinbasevalue', 'proposal', 'serverlist', 'workid'"},
                }},
                {"rules", RPCArg::Type::ARR, RPCArg::Optional::NO, "A list of strings",
                {
                    {"segwit", RPCArg::Type::STR, RPCArg::Optional::NO, "(literal) indicates client side segwit support"},
                    {"str", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "other client side supported softfork deployment"},
                }},
                {"longpollid", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "delay processing request until the result would vary significantly from the \"longpollid\" of a prior template"},
                {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "proposed block data to check, encoded in hexadecimal; valid only for mode=\"proposal\""},
            },
            },
        },
        {
            RPCResult{"If the proposal was accepted with mode=='proposal'", RPCResult::Type::NONE, "", ""},
            RPCResult{"If the proposal was not accepted with mode=='proposal'", RPCResult::Type::STR, "", "According to BIP22"},
            RPCResult{"Otherwise", RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::NUM, "version", "The preferred block version"},
                {RPCResult::Type::ARR, "rules", "specific block rules that are to be enforced",
                {
                    {RPCResult::Type::STR, "", "name of a rule the client must understand to some extent; see BIP 9 for format"},
                }},
                {RPCResult::Type::OBJ_DYN, "vbavailable", "set of pending, supported versionbit (BIP 9) softfork deployments",
                {
                    {RPCResult::Type::NUM, "rulename", "identifies the bit number as indicating acceptance and readiness for the named softfork rule"},
                }},
                {RPCResult::Type::ARR, "capabilities", "",
                {
                    {RPCResult::Type::STR, "value", "A supported feature, for example 'proposal'"},
                }},
                {RPCResult::Type::NUM, "vbrequired", "bit mask of versionbits the server requires set in submissions"},
                {RPCResult::Type::STR, "previousblockhash", "The hash of current highest block"},
                {RPCResult::Type::ARR, "transactions", "contents of non-coinbase transactions that should be included in the next block",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "data", "transaction data encoded in hexadecimal (byte-for-byte)"},
                        {RPCResult::Type::STR_HEX, "txid", "transaction id encoded in little-endian hexadecimal"},
                        {RPCResult::Type::STR_HEX, "hash", "hash encoded in little-endian hexadecimal (including witness data)"},
                        {RPCResult::Type::ARR, "depends", "array of numbers",
                        {
                            {RPCResult::Type::NUM, "", "transactions before this one (by 1-based index in 'transactions' list) that must be present in the final block if this one is"},
                        }},
                        {RPCResult::Type::NUM, "fee", "difference in value between transaction inputs and outputs (in satoshis); for coinbase transactions, this is a negative Number of the total collected block fees (ie, not including the block subsidy); if key is not present, fee is unknown and clients MUST NOT assume there isn't one"},
                        {RPCResult::Type::NUM, "sigops", "total SigOps cost, as counted for purposes of block limits; if key is not present, sigop cost is unknown and clients MUST NOT assume it is zero"},
                        {RPCResult::Type::NUM, "weight", "total transaction weight, as counted for purposes of block limits"},
                    }},
                }},
                {RPCResult::Type::OBJ_DYN, "coinbaseaux", "data that should be included in the coinbase's scriptSig content",
                {
                    {RPCResult::Type::STR_HEX, "key", "values must be in the coinbase (keys may be ignored)"},
                }},
                {RPCResult::Type::NUM, "coinbasevalue", "maximum allowable input to coinbase transaction, including the generation award and transaction fees (in satoshis)"},
                {RPCResult::Type::STR, "longpollid", "an id to include with a request to longpoll on an update to this template"},
                {RPCResult::Type::STR, "target", "The hash target"},
                {RPCResult::Type::NUM_TIME, "mintime", "The minimum timestamp appropriate for the next block time, expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::ARR, "mutable", "list of ways the block template may be changed",
                {
                    {RPCResult::Type::STR, "value", "A way the block template may be changed, e.g. 'time', 'transactions', 'prevblock'"},
                }},
                {RPCResult::Type::STR_HEX, "noncerange", "A range of valid nonces"},
                {RPCResult::Type::NUM, "sigoplimit", "limit of sigops in blocks"},
                {RPCResult::Type::NUM, "sizelimit", "limit of block size"},
                {RPCResult::Type::NUM, "weightlimit", /*optional=*/true, "limit of block weight"},
                {RPCResult::Type::NUM_TIME, "curtime", "current timestamp in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::STR, "bits", "compressed target of next block"},
                {RPCResult::Type::NUM, "height", "The height of the next block"},
                {RPCResult::Type::STR_HEX, "signet_challenge", /*optional=*/true, "Only on signet"},
                {RPCResult::Type::STR_HEX, "default_witness_commitment", /*optional=*/true, "a valid witness commitment for the unmodified block template"},
            }},
        },
        RPCExamples{
                    HelpExampleCli("getblocktemplate", "'{\"rules\": [\"segwit\"]}'")
            + HelpExampleRpc("getblocktemplate", "{\"rules\": [\"segwit\"]}")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    Mining& miner = EnsureMining(node);
    LOCK(cs_main);
    uint256 tip{CHECK_NONFATAL(miner.getTip()).value().hash};

    std::string strMode = "template";
    UniValue lpval = NullUniValue;
    std::set<std::string> setClientRules;
    if (!request.params[0].isNull())
    {
        const UniValue& oparam = request.params[0].get_obj();
        const UniValue& modeval = oparam.find_value("mode");
        if (modeval.isStr())
            strMode = modeval.get_str();
        else if (modeval.isNull())
        {
            /* Do nothing */
        }
        else
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid mode");
        lpval = oparam.find_value("longpollid");

        if (strMode == "proposal")
        {
            const UniValue& dataval = oparam.find_value("data");
            if (!dataval.isStr())
                throw JSONRPCError(RPC_TYPE_ERROR, "Missing data String key for proposal");

            CBlock block;
            if (!DecodeHexBlk(block, dataval.get_str()))
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "Block decode failed");

            uint256 hash = block.GetHash();
            const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(hash);
            if (pindex) {
                if (pindex->IsValid(BLOCK_VALID_SCRIPTS))
                    return "duplicate";
                if (pindex->nStatus & BLOCK_FAILED_MASK)
                    return "duplicate-invalid";
                return "duplicate-inconclusive";
            }

            // testBlockValidity only supports blocks built on the current Tip
            if (block.hashPrevBlock != tip) {
                return "inconclusive-not-best-prevblk";
            }
            BlockValidationState state;
            miner.testBlockValidity(block, /*check_merkle_root=*/true, state);
            return BIP22ValidationResult(state);
        }

        const UniValue& aClientRules = oparam.find_value("rules");
        if (aClientRules.isArray()) {
            for (unsigned int i = 0; i < aClientRules.size(); ++i) {
                const UniValue& v = aClientRules[i];
                setClientRules.insert(v.get_str());
            }
        }
    }

    if (strMode != "template")
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid mode");

    if (!miner.isTestChain()) {
        const CConnman& connman = EnsureConnman(node);
        if (connman.GetNodeCount(ConnectionDirection::Both) == 0) {
            throw JSONRPCError(RPC_CLIENT_NOT_CONNECTED, PACKAGE_NAME " is not connected!");
        }

        if (miner.isInitialBlockDownload()) {
            throw JSONRPCError(RPC_CLIENT_IN_INITIAL_DOWNLOAD, PACKAGE_NAME " is in initial sync and waiting for blocks...");
        }
    }

    static unsigned int nTransactionsUpdatedLast;

    if (!lpval.isNull())
    {
        // Wait to respond until either the best block changes, OR a minute has passed and there are more transactions
        uint256 hashWatchedChain;
        unsigned int nTransactionsUpdatedLastLP;

        if (lpval.isStr())
        {
            // Format: <hashBestChain><nTransactionsUpdatedLast>
            const std::string& lpstr = lpval.get_str();

            hashWatchedChain = ParseHashV(lpstr.substr(0, 64), "longpollid");
            nTransactionsUpdatedLastLP = LocaleIndependentAtoi<int64_t>(lpstr.substr(64));
        }
        else
        {
            // NOTE: Spec does not specify behaviour for non-string longpollid, but this makes testing easier
            hashWatchedChain = tip;
            nTransactionsUpdatedLastLP = nTransactionsUpdatedLast;
        }

        // Release lock while waiting
        LEAVE_CRITICAL_SECTION(cs_main);
        {
            MillisecondsDouble checktxtime{std::chrono::minutes(1)};
            while (tip == hashWatchedChain && IsRPCRunning()) {
                tip = miner.waitTipChanged(hashWatchedChain, checktxtime).hash;
                // Timeout: Check transactions for update
                // without holding the mempool lock to avoid deadlocks
                if (miner.getTransactionsUpdated() != nTransactionsUpdatedLastLP)
                    break;
                checktxtime = std::chrono::seconds(10);
            }
        }
        ENTER_CRITICAL_SECTION(cs_main);

        tip = CHECK_NONFATAL(miner.getTip()).value().hash;

        if (!IsRPCRunning())
            throw JSONRPCError(RPC_CLIENT_NOT_CONNECTED, "Shutting down");
        // TODO: Maybe recheck connections/IBD and (if something wrong) send an expires-immediately template to stop miners?
    }

    const Consensus::Params& consensusParams = chainman.GetParams().GetConsensus();

    // GBT must be called with 'signet' set in the rules for signet chains
    if (consensusParams.signet_blocks && setClientRules.count("signet") != 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "getblocktemplate must be called with the signet rule set (call with {\"rules\": [\"segwit\", \"signet\"]})");
    }

    // GBT must be called with 'segwit' set in the rules
    if (setClientRules.count("segwit") != 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "getblocktemplate must be called with the segwit rule set (call with {\"rules\": [\"segwit\"]})");
    }

    // Update block
    static CBlockIndex* pindexPrev;
    static int64_t time_start;
    static std::unique_ptr<BlockTemplate> block_template;
    if (!pindexPrev || pindexPrev->GetBlockHash() != tip ||
        (miner.getTransactionsUpdated() != nTransactionsUpdatedLast && GetTime() - time_start > 5))
    {
        // Clear pindexPrev so future calls make a new block, despite any failures from here on
        pindexPrev = nullptr;

        // Store the pindexBest used before createNewBlock, to avoid races
        nTransactionsUpdatedLast = miner.getTransactionsUpdated();
        CBlockIndex* pindexPrevNew = chainman.m_blockman.LookupBlockIndex(tip);
        time_start = GetTime();

        // Create new block
        CScript scriptDummy = CScript() << OP_TRUE;
        block_template = miner.createNewBlock(scriptDummy);
        CHECK_NONFATAL(block_template);


        // Need to update only after we know createNewBlock succeeded
        pindexPrev = pindexPrevNew;
    }
    CHECK_NONFATAL(pindexPrev);
    CBlock block{block_template->getBlock()};

    // Update nTime
    UpdateTime(&block, consensusParams, pindexPrev);
    block.nNonce = 0;

    // NOTE: If at some point we support pre-segwit miners post-segwit-activation, this needs to take segwit support into consideration
    const bool fPreSegWit = !DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_SEGWIT);

    UniValue aCaps(UniValue::VARR); aCaps.push_back("proposal");

    UniValue transactions(UniValue::VARR);
    std::map<uint256, int64_t> setTxIndex;
    std::vector<CAmount> tx_fees{block_template->getTxFees()};
    std::vector<CAmount> tx_sigops{block_template->getTxSigops()};

    int i = 0;
    for (const auto& it : block.vtx) {
        const CTransaction& tx = *it;
        uint256 txHash = tx.GetHash();
        setTxIndex[txHash] = i++;

        if (tx.IsCoinBase())
            continue;

        UniValue entry(UniValue::VOBJ);

        entry.pushKV("data", EncodeHexTx(tx));
        entry.pushKV("txid", txHash.GetHex());
        entry.pushKV("hash", tx.GetWitnessHash().GetHex());

        UniValue deps(UniValue::VARR);
        for (const CTxIn &in : tx.vin)
        {
            if (setTxIndex.count(in.prevout.hash))
                deps.push_back(setTxIndex[in.prevout.hash]);
        }
        entry.pushKV("depends", std::move(deps));

        int index_in_template = i - 1;
        entry.pushKV("fee", tx_fees.at(index_in_template));
        int64_t nTxSigOps{tx_sigops.at(index_in_template)};
        if (fPreSegWit) {
            CHECK_NONFATAL(nTxSigOps % WITNESS_SCALE_FACTOR == 0);
            nTxSigOps /= WITNESS_SCALE_FACTOR;
        }
        entry.pushKV("sigops", nTxSigOps);
        entry.pushKV("weight", GetTransactionWeight(tx));

        transactions.push_back(std::move(entry));
    }

    UniValue aux(UniValue::VOBJ);

    arith_uint256 hashTarget = arith_uint256().SetCompact(block.nBits);

    UniValue aMutable(UniValue::VARR);
    aMutable.push_back("time");
    aMutable.push_back("transactions");
    aMutable.push_back("prevblock");

    UniValue result(UniValue::VOBJ);
    result.pushKV("capabilities", std::move(aCaps));

    UniValue aRules(UniValue::VARR);
    aRules.push_back("csv");
    if (!fPreSegWit) aRules.push_back("!segwit");
    if (consensusParams.signet_blocks) {
        // indicate to miner that they must understand signet rules
        // when attempting to mine with this template
        aRules.push_back("!signet");
    }

    UniValue vbavailable(UniValue::VOBJ);
    for (int j = 0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
        Consensus::DeploymentPos pos = Consensus::DeploymentPos(j);
        ThresholdState state = chainman.m_versionbitscache.State(pindexPrev, consensusParams, pos);
        switch (state) {
            case ThresholdState::DEFINED:
            case ThresholdState::FAILED:
                // Not exposed to GBT at all
                break;
            case ThresholdState::LOCKED_IN:
                // Ensure bit is set in block version
                block.nVersion |= chainman.m_versionbitscache.Mask(consensusParams, pos);
                [[fallthrough]];
            case ThresholdState::STARTED:
            {
                const struct VBDeploymentInfo& vbinfo = VersionBitsDeploymentInfo[pos];
                vbavailable.pushKV(gbt_vb_name(pos), consensusParams.vDeployments[pos].bit);
                if (setClientRules.find(vbinfo.name) == setClientRules.end()) {
                    if (!vbinfo.gbt_force) {
                        // If the client doesn't support this, don't indicate it in the [default] version
                        block.nVersion &= ~chainman.m_versionbitscache.Mask(consensusParams, pos);
                    }
                }
                break;
            }
            case ThresholdState::ACTIVE:
            {
                // Add to rules only
                const struct VBDeploymentInfo& vbinfo = VersionBitsDeploymentInfo[pos];
                aRules.push_back(gbt_vb_name(pos));
                if (setClientRules.find(vbinfo.name) == setClientRules.end()) {
                    // Not supported by the client; make sure it's safe to proceed
                    if (!vbinfo.gbt_force) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Support for '%s' rule requires explicit client support", vbinfo.name));
                    }
                }
                break;
            }
        }
    }
    result.pushKV("version", block.nVersion);
    result.pushKV("rules", std::move(aRules));
    result.pushKV("vbavailable", std::move(vbavailable));
    result.pushKV("vbrequired", int(0));

    result.pushKV("previousblockhash", block.hashPrevBlock.GetHex());
    result.pushKV("transactions", std::move(transactions));
    result.pushKV("coinbaseaux", std::move(aux));
    result.pushKV("coinbasevalue", (int64_t)block.vtx[0]->vout[0].nValue);
    result.pushKV("longpollid", tip.GetHex() + ToString(nTransactionsUpdatedLast));
    result.pushKV("target", hashTarget.GetHex());
    result.pushKV("mintime", (int64_t)pindexPrev->GetMedianTimePast()+1);
    result.pushKV("mutable", std::move(aMutable));
    result.pushKV("noncerange", "00000000ffffffff");
    int64_t nSigOpLimit = MAX_BLOCK_SIGOPS_COST;
    int64_t nSizeLimit = MAX_BLOCK_SERIALIZED_SIZE;
    if (fPreSegWit) {
        CHECK_NONFATAL(nSigOpLimit % WITNESS_SCALE_FACTOR == 0);
        nSigOpLimit /= WITNESS_SCALE_FACTOR;
        CHECK_NONFATAL(nSizeLimit % WITNESS_SCALE_FACTOR == 0);
        nSizeLimit /= WITNESS_SCALE_FACTOR;
    }
    result.pushKV("sigoplimit", nSigOpLimit);
    result.pushKV("sizelimit", nSizeLimit);
    if (!fPreSegWit) {
        result.pushKV("weightlimit", (int64_t)MAX_BLOCK_WEIGHT);
    }
    result.pushKV("curtime", block.GetBlockTime());
    result.pushKV("bits", strprintf("%08x", block.nBits));
    result.pushKV("height", (int64_t)(pindexPrev->nHeight+1));

    if (consensusParams.signet_blocks) {
        result.pushKV("signet_challenge", HexStr(consensusParams.signet_challenge));
    }

    if (!block_template->getCoinbaseCommitment().empty()) {
        result.pushKV("default_witness_commitment", HexStr(block_template->getCoinbaseCommitment()));
    }

    return result;
},
    };
}